

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

dtree_t * read_final_tree(FILE *fp,pset_t *pset,uint32 n_pset)

{
  float64 *pfVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  dtree_t *pdVar5;
  lineiter_t *plVar6;
  dtree_node_t *pdVar7;
  ulong uVar8;
  ulong uVar9;
  comp_quest_t *q;
  ulong uVar10;
  dtree_node_t *pdVar11;
  char *pcVar12;
  uint32 n_scan;
  uint32 node_id;
  float32 occ;
  uint32 n_node;
  float64 ent;
  char str [128];
  uint local_f4;
  int local_f0;
  uint local_ec;
  dtree_t *local_e8;
  uint32 local_dc;
  float32 local_d8;
  uint local_d4;
  pset_t *local_d0;
  lineiter_t *local_c8;
  float64 local_c0;
  short local_b8;
  undefined1 uStack_b6;
  int iStack_b5;
  
  local_dc = n_pset;
  local_d0 = pset;
  pdVar5 = (dtree_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x111);
  plVar6 = lineiter_start_clean(fp);
  pcVar12 = plVar6->buf;
  __isoc99_sscanf(pcVar12,"%s%n",&local_b8,&local_f4);
  if (iStack_b5 == 0x65646f &&
      CONCAT13((undefined1)iStack_b5,CONCAT12(uStack_b6,local_b8)) == 0x6f6e5f6e) {
    __isoc99_sscanf(pcVar12 + local_f4,"%u",&local_d4);
    pdVar5->n_node = local_d4;
    pdVar7 = (dtree_node_t *)
             __ckd_calloc__((ulong)local_d4,0x68,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                            ,0x120);
    pdVar5->node = pdVar7;
    if (local_d4 != 0) {
      uVar8 = 0;
      pdVar11 = pdVar7;
      do {
        pdVar11->node_id = (uint32)uVar8;
        uVar8 = uVar8 + 1;
        pdVar11 = pdVar11 + 1;
      } while (uVar8 < local_d4);
    }
    local_e8 = pdVar5;
    plVar6 = lineiter_next(plVar6);
    pdVar5 = local_e8;
    if (plVar6 != (lineiter_t *)0x0) {
      local_f0 = 0;
      do {
        pcVar12 = plVar6->buf;
        local_c8 = plVar6;
        __isoc99_sscanf(pcVar12,"%u%n",&local_ec,&local_f4);
        pcVar12 = pcVar12 + local_f4;
        __isoc99_sscanf(pcVar12,"%s%n",&local_b8,&local_f4);
        uVar8 = (ulong)local_f4;
        uVar2 = 0xffffffff;
        if (local_b8 != 0x2d) {
          uVar2 = atoi((char *)&local_b8);
        }
        pcVar12 = pcVar12 + uVar8;
        __isoc99_sscanf(pcVar12,"%s%n",&local_b8,&local_f4);
        uVar10 = (ulong)local_f4;
        uVar8 = 0xffffffff;
        if (local_b8 != 0x2d) {
          uVar3 = atoi((char *)&local_b8);
          uVar8 = (ulong)uVar3;
        }
        pcVar12 = pcVar12 + uVar10;
        __isoc99_sscanf(pcVar12,"%le%n",&local_c0,&local_f4);
        uVar10 = (ulong)local_f4;
        __isoc99_sscanf(pcVar12 + uVar10,"%e%n",&local_d8,&local_f4);
        if (uVar2 == 0xffffffff) {
          q = (comp_quest_t *)0x0;
        }
        else {
          uVar9 = (ulong)local_f4;
          q = (comp_quest_t *)
              __ckd_calloc__(1,0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x142);
          iVar4 = s3parse_comp_quest(local_d0,local_dc,q,pcVar12 + uVar10 + uVar9);
          if (iVar4 != 0) {
            local_f0 = 1;
          }
        }
        pdVar7[local_ec].q = q;
        pfVar1 = &pdVar7->wt_ent_dec;
        if (uVar2 == 0xffffffff) {
          pfVar1 = &pdVar7->wt_ent;
        }
        pfVar1[(ulong)local_ec * 0xd] = local_c0;
        uVar10 = (ulong)local_ec;
        pdVar7[uVar10].occ = local_d8;
        if (uVar2 == 0xffffffff) {
          pdVar7[uVar10].y = (dtree_node_str *)0x0;
          (&pdVar7[uVar10].y)[1] = (dtree_node_str *)0x0;
        }
        else {
          pdVar7[uVar10].y = pdVar7 + uVar2;
          pdVar7[uVar10].n = pdVar7 + uVar8;
          pdVar7[uVar8].p = pdVar7 + uVar10;
          pdVar7[uVar2].p = pdVar7 + uVar10;
        }
        plVar6 = lineiter_next(local_c8);
      } while (plVar6 != (lineiter_t *)0x0);
      pdVar5 = local_e8;
      if (local_f0 == 1) {
        free_tree(local_e8);
        pdVar5 = (dtree_t *)0x0;
      }
    }
    lineiter_free((lineiter_t *)0x0);
    return pdVar5;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
          ,0x11c,"Format error; expecting n_node\n");
  exit(1);
}

Assistant:

dtree_t *
read_final_tree(FILE *fp,
		pset_t *pset,
		uint32 n_pset)
{
    dtree_t *out;
    dtree_node_t *node;
    uint32  n_node;
    char *s, str[128];
    lineiter_t *ln = NULL;
    uint32 n_scan;
    uint32 i, node_id, node_id_y, node_id_n;
    comp_quest_t *q;
    float64 ent;
    float32 occ;
    int err;

    out = ckd_calloc(1, sizeof(dtree_t));

    ln = lineiter_start_clean(fp);
    
    s = ln->buf;
    sscanf(s, "%s%n", str, &n_scan);
    if (strcmp(str, "n_node") == 0) {
	s += n_scan;
	sscanf(s, "%u", &n_node);
    }
    else {
	E_FATAL("Format error; expecting n_node\n");
    }

    out->n_node = n_node;
    out->node = node = ckd_calloc(n_node, sizeof(dtree_node_t));

    for (i = 0; i < n_node; i++)
	node[i].node_id = i;
    
    err = FALSE;
    
    while ((ln = lineiter_next(ln))) {
	s = ln->buf;

	sscanf(s, "%u%n", &node_id, &n_scan);
	s += n_scan;
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_y = NO_ID;
	}
	else {
	    node_id_y = atoi(str);
	}
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_n = NO_ID;
	}
	else {
	    node_id_n = atoi(str);
	}
	sscanf(s, "%le%n", &ent, &n_scan);
	s += n_scan;
	sscanf(s, "%e%n", &occ, &n_scan);
	s += n_scan;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    q = (comp_quest_t *)ckd_calloc(1, sizeof(comp_quest_t));
	    if (s3parse_comp_quest(pset, n_pset, q, s) != S3_SUCCESS) {
		err = TRUE;
	    }

	    node[node_id].q = q;
	}
	else
	    node[node_id].q = NULL;

	/* ck if internal node */
	if ((node_id_y != NO_ID) && (node_id_y != NO_ID))
	    node[node_id].wt_ent_dec = ent;
	else
	    node[node_id].wt_ent = ent;

	node[node_id].occ = occ;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    node[node_id].y = &node[node_id_y];
	    node[node_id].n = &node[node_id_n];
	    node[node_id_y].p = node[node_id_n].p = &node[node_id];
	}
	else {
	    node[node_id].y = NULL;
	    node[node_id].n = NULL;
	}
    }

    if (err == TRUE) {
	free_tree(out);
	out = NULL;
    }

    lineiter_free(ln);
    return out;
}